

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffmaky(fitsfile *fptr,int nrec,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  
  iVar2 = fptr->HDUposition;
  pFVar1 = fptr->Fptr;
  if (iVar2 != pFVar1->curhdu) {
    ffmahd(fptr,iVar2 + 1,(int *)0x0,status);
    pFVar1 = fptr->Fptr;
    iVar2 = pFVar1->curhdu;
  }
  pFVar1->nextkey = (long)(nrec * 0x50 + -0x50) + pFVar1->headstart[iVar2];
  return *status;
}

Assistant:

int ffmaky(fitsfile *fptr,    /* I - FITS file pointer                    */
          int nrec,           /* I - one-based keyword number to move to  */
          int *status)        /* IO - error status                        */
{
/*
  move pointer to the specified absolute keyword position.  E.g. this keyword 
  will then be read by the next call to ffgnky.
*/
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] + ( (nrec - 1) * 80);

    return(*status);
}